

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

void * HokuyoThread(void *pParam)

{
  double dVar1;
  int iVar2;
  int iVar3;
  HOKUYO *pHokuyo;
  int iVar4;
  char *pcVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  CRITICAL_SECTION *__mutex;
  long lVar11;
  char databuf [8192];
  double angles [2048];
  double distances [2048];
  int local_a054;
  undefined8 local_a050;
  HOKUYO *local_a048;
  void *local_a040;
  char local_a038 [8192];
  double local_8038 [2048];
  double local_4038 [2049];
  
  __mutex = HokuyoCS;
  lVar7 = 0;
  lVar11 = 0;
  do {
    if (*(void **)((long)addrsHokuyo + lVar7 * 2) == pParam) {
      local_a040 = (void *)((long)distancesHokuyo[0] + lVar11);
      local_a050 = 0;
      local_a048 = (HOKUYO *)pParam;
      do {
        pHokuyo = local_a048;
        memset(local_4038,0,0x4000);
        memset(local_8038,0,0x4000);
        memset(local_a038,0,0x2000);
        local_a054 = 0;
        iVar4 = GetLatestHokuyoMessageHokuyo(pHokuyo,local_a038,0x2000,&local_a054);
        if (iVar4 == 0) {
          uVar6 = local_a050;
          if (0 < local_a054) {
            iVar4 = pHokuyo->StartingStep;
            iVar2 = pHokuyo->SlitDivision;
            iVar3 = pHokuyo->FrontStep;
            dVar1 = pHokuyo->StepAngleSize;
            pcVar5 = local_a038;
            uVar8 = 0;
            do {
              local_8038[uVar8] =
                   ((double)((iVar4 - iVar3) + iVar2 / 2 + (int)uVar8) * dVar1 * 3.141592653589793)
                   / 180.0 + -3.141592653589793;
              lVar9 = 0;
              uVar10 = 0;
              do {
                uVar10 = (int)pcVar5[lVar9] - 0x30U | uVar10 << 6;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              local_4038[uVar8] = (double)(int)uVar10 / 1000.0;
              uVar8 = uVar8 + 1;
              pcVar5 = pcVar5 + 3;
            } while (uVar8 != (local_a054 - 1U) / 3 + 1);
          }
        }
        else {
          uVar6 = 1;
        }
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        memcpy(local_a040,local_4038,0x4000);
        memcpy((void *)((long)anglesHokuyo[0] + lVar11),local_8038,0x4000);
        *(int *)((long)resHokuyo + lVar7) = (int)uVar6;
        local_a050 = uVar6;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      } while (*(int *)((long)bExitHokuyo + lVar7) == 0);
      return (void *)0x0;
    }
    __mutex = __mutex + 1;
    lVar11 = lVar11 + 0x4000;
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x40);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE HokuyoThread(void* pParam)
{
	HOKUYO* pHokuyo = (HOKUYO*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	double angles[MAX_SLITDIVISION_HOKUYO];
	double distances[MAX_SLITDIVISION_HOKUYO];

	while (addrsHokuyo[id] != pHokuyo)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	for (;;)
	{
		//mSleep(pHokuyo->threadperiod);
		memset(distances, 0, MAX_SLITDIVISION_HOKUYO*sizeof(double));
		memset(angles, 0, MAX_SLITDIVISION_HOKUYO*sizeof(double));
		res = GetLatestDataHokuyo(pHokuyo, distances, angles);
		if (res != EXIT_SUCCESS) err = res;
		// if (GetLatestDataHokuyo(pHokuyo, distances, angles) == EXIT8SUCCESS)
		{
			EnterCriticalSection(&HokuyoCS[id]);
			memcpy(distancesHokuyo[id], distances, MAX_SLITDIVISION_HOKUYO*sizeof(double));
			memcpy(anglesHokuyo[id], angles, MAX_SLITDIVISION_HOKUYO*sizeof(double));
			resHokuyo[id] = err;
			LeaveCriticalSection(&HokuyoCS[id]);
		}
		if (bExitHokuyo[id]) break;
	}

	return 0;
}